

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sms_Apu.cpp
# Opt level: O3

void __thiscall
Sms_Apu::output(Sms_Apu *this,Blip_Buffer *center,Blip_Buffer *left,Blip_Buffer *right)

{
  Sms_Osc *pSVar1;
  int i;
  long lVar2;
  
  lVar2 = 0;
  do {
    pSVar1 = this->oscs[lVar2];
    pSVar1->outputs[1] = right;
    pSVar1->outputs[2] = left;
    pSVar1->outputs[3] = center;
    pSVar1->output = pSVar1->outputs[pSVar1->output_select];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  return;
}

Assistant:

void Sms_Apu::output( Blip_Buffer* center, Blip_Buffer* left, Blip_Buffer* right )
{
	for ( int i = 0; i < osc_count; i++ )
		osc_output( i, center, left, right );
}